

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *in,QByteArray *ba)

{
  long size;
  QArrayData *pQVar1;
  Data *pDVar2;
  qint64 qVar3;
  undefined1 *puVar4;
  Status status;
  long len;
  long lVar5;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  undefined1 *local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &((ba->d).d)->super_QArrayData;
  (ba->d).d = (Data *)0x0;
  (ba->d).ptr = (char *)0x0;
  (ba->d).size = 0;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(in,(qint32 *)&local_3c);
  puVar4 = (undefined1 *)(ulong)local_3c;
  if (puVar4 == (undefined1 *)0xffffffff) {
    puVar4 = (undefined1 *)0xffffffffffffffff;
  }
  else if ((local_3c == 0xfffffffe) && (0x15 < in->ver)) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(in,(qint64 *)&local_48);
    puVar4 = local_48;
    if ((long)local_48 < -1) {
      pQVar1 = &((ba->d).d)->super_QArrayData;
      (ba->d).d = (Data *)0x0;
      (ba->d).ptr = (char *)0x0;
      (ba->d).size = 0;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,1,0x10);
        }
      }
      status = SizeLimitExceeded;
LAB_00302e71:
      QDataStream::setStatus(in,status);
      goto LAB_00302e76;
    }
  }
  if (puVar4 == (undefined1 *)0xffffffffffffffff) {
    pQVar1 = &((ba->d).d)->super_QArrayData;
    (ba->d).d = (Data *)0x0;
    (ba->d).ptr = (char *)0x0;
    (ba->d).size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
  }
  else {
    lVar5 = 0;
    do {
      len = (long)puVar4 - lVar5;
      if (0xfffff < len) {
        len = 0x100000;
      }
      size = lVar5 + len;
      QByteArray::resize(ba,size);
      pDVar2 = (ba->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(ba,(ba->d).size,KeepSize);
      }
      qVar3 = QDataStream::readRawData(in,(ba->d).ptr + lVar5,len);
      if (qVar3 != len) {
        pQVar1 = &((ba->d).d)->super_QArrayData;
        (ba->d).d = (Data *)0x0;
        (ba->d).ptr = (char *)0x0;
        (ba->d).size = 0;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,1,0x10);
          }
        }
        status = ReadPastEnd;
        goto LAB_00302e71;
      }
      lVar5 = size;
    } while (size < (long)puVar4);
  }
LAB_00302e76:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QByteArray &ba)
{
    ba.clear();

    qint64 size = QDataStream::readQSizeType(in);
    qsizetype len = size;
    if (size != len || size < -1) {
        ba.clear();
        in.setStatus(QDataStream::SizeLimitExceeded);
        return in;
    }
    if (len == -1) { // null byte-array
        ba = QByteArray();
        return in;
    }

    constexpr qsizetype Step = 1024 * 1024;
    qsizetype allocated = 0;

    do {
        qsizetype blockSize = qMin(Step, len - allocated);
        ba.resize(allocated + blockSize);
        if (in.readRawData(ba.data() + allocated, blockSize) != blockSize) {
            ba.clear();
            in.setStatus(QDataStream::ReadPastEnd);
            return in;
        }
        allocated += blockSize;
    } while (allocated < len);

    return in;
}